

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

Module * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::Module,LLVMBC::LLVMContext&>
          (LLVMContext *this,LLVMContext *u)

{
  Module *this_00;
  
  this_00 = (Module *)allocate(this,0xc0,8);
  if (this_00 != (Module *)0x0) {
    Module::Module(this_00,u);
    append_typed_destructor<LLVMBC::Module>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}